

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O0

bool __thiscall
QResourceFileEngine::extension
          (QResourceFileEngine *this,Extension extension,ExtensionOption *option,
          ExtensionReturn *output)

{
  QResourceFileEnginePrivate *this_00;
  uchar *puVar1;
  long *in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  long in_FS_OFFSET;
  bool bVar2;
  QResourceFileEnginePrivate *unaff_retaddr;
  UnMapExtensionOption *options_1;
  MapExtensionReturn *returnValue;
  MapExtensionOption *options;
  QResourceFileEnginePrivate *d;
  undefined4 in_stack_fffffffffffffff0;
  qint64 offset;
  
  offset = *(qint64 *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QResourceFileEngine *)0x2ea823);
  if (in_ESI == 2) {
    puVar1 = QResourceFileEnginePrivate::map
                       (unaff_retaddr,offset,
                        CONCAT44(*(undefined4 *)(in_RDX + 2),in_stack_fffffffffffffff0),
                        (MemoryMapFlags)extension);
    *in_RCX = (long)puVar1;
    bVar2 = *in_RCX != 0;
  }
  else if (in_ESI == 3) {
    bVar2 = QResourceFileEnginePrivate::unmap(this_00,(uchar *)*in_RDX);
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == offset) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QResourceFileEngine::extension(Extension extension, const ExtensionOption *option, ExtensionReturn *output)
{
    Q_D(QResourceFileEngine);
    if (extension == MapExtension) {
        const auto *options = static_cast<const MapExtensionOption *>(option);
        auto *returnValue = static_cast<MapExtensionReturn *>(output);
        returnValue->address = d->map(options->offset, options->size, options->flags);
        return (returnValue->address != nullptr);
    }
    if (extension == UnMapExtension) {
        const auto *options = static_cast<const UnMapExtensionOption *>(option);
        return d->unmap(options->address);
    }
    return false;
}